

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void wiznet(char *string,CHAR_DATA *ch,OBJ_DATA *obj,long flag,long flag_skip,int min_level)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  DESCRIPTOR_DATA **ppDVar6;
  CHAR_DATA *pCVar7;
  double dVar8;
  char str [4608];
  
  ppDVar6 = &descriptor_list;
LAB_002c36f7:
  do {
    do {
      ppDVar6 = &((DESCRIPTOR_DATA *)ppDVar6)->next->next;
      if ((DESCRIPTOR_DATA *)ppDVar6 == (DESCRIPTOR_DATA *)0x0) {
        return;
      }
    } while ((((DESCRIPTOR_DATA *)ppDVar6)->connected != 0) ||
            (((DESCRIPTOR_DATA *)ppDVar6)->character == (CHAR_DATA *)0x0));
    bVar2 = is_immortal(((DESCRIPTOR_DATA *)ppDVar6)->character);
  } while ((!bVar2) ||
          (pCVar7 = ((DESCRIPTOR_DATA *)ppDVar6)->character, (pCVar7->wiznet[0] & 1) == 0));
  if (flag != 0) goto code_r0x002c372e;
  goto LAB_002c374f;
code_r0x002c372e:
  uVar1 = pCVar7->wiznet[(int)(flag / 0x20)];
  dVar8 = exp2((double)(flag % 0x20));
  if ((uVar1 & (long)dVar8) != 0) {
    pCVar7 = ((DESCRIPTOR_DATA *)ppDVar6)->character;
LAB_002c374f:
    if (flag_skip != 0) {
      uVar1 = pCVar7->wiznet[(int)(flag_skip / 0x20)];
      dVar8 = exp2((double)(flag_skip % 0x20));
      if ((uVar1 & (long)dVar8) != 0) goto LAB_002c36f7;
      pCVar7 = ((DESCRIPTOR_DATA *)ppDVar6)->character;
    }
    iVar3 = get_trust(pCVar7);
    if ((min_level <= iVar3) && (pCVar7 = ((DESCRIPTOR_DATA *)ppDVar6)->character, pCVar7 != ch)) {
      if ((pCVar7->wiznet[0] & 0x40000) != 0) {
        send_to_char("--> ",pCVar7);
        pCVar7 = ((DESCRIPTOR_DATA *)ppDVar6)->character;
      }
      pcVar4 = get_char_color(pCVar7,"wiznet");
      pcVar5 = END_COLOR(((DESCRIPTOR_DATA *)ppDVar6)->character);
      sprintf(str,"%s%s%s",pcVar4,string,pcVar5);
      act_new(str,((DESCRIPTOR_DATA *)ppDVar6)->character,obj,ch,3,0);
    }
  }
  goto LAB_002c36f7;
}

Assistant:

void wiznet(char *string, CHAR_DATA *ch, OBJ_DATA *obj, long flag, long flag_skip, int min_level)
{
	char str[MAX_STRING_LENGTH];

	for (DESCRIPTOR_DATA *d = descriptor_list; d != nullptr; d = d->next)
	{
		if (d->connected == CON_PLAYING
			&& d->character
			&& is_immortal(d->character)
			&& IS_SET(d->character->wiznet, WIZ_ON)
			&& (!flag || IS_SET(d->character->wiznet, flag))
			&& (!flag_skip || !IS_SET(d->character->wiznet, flag_skip))
			&& get_trust(d->character) >= min_level
			&& d->character != ch)
		{
			if (IS_SET(d->character->wiznet, WIZ_PREFIX))
				send_to_char("--> ", d->character);

			sprintf(str, "%s%s%s", get_char_color(d->character, "wiznet"), string, END_COLOR(d->character));
			act_new(str, d->character, obj, ch, TO_CHAR, POS_DEAD);
		}
	}
}